

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O2

void accessPreviewImage(char *fileName)

{
  char cVar1;
  int iVar2;
  RgbaInputFile file;
  RgbaInputFile local_50 [64];
  
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile(local_50,fileName,iVar2);
  Imf_3_4::RgbaInputFile::header();
  cVar1 = Imf_3_4::Header::hasPreviewImage();
  if (cVar1 != '\0') {
    Imf_3_4::RgbaInputFile::header();
    Imf_3_4::Header::previewImage();
  }
  Imf_3_4::RgbaInputFile::~RgbaInputFile(local_50);
  return;
}

Assistant:

void
accessPreviewImage (const char fileName[])
{
    // [begin accessPreviewImage]
    RgbaInputFile file (fileName);
        
    if (file.header().hasPreviewImage())
    {
        const PreviewImage &preview = file.header().previewImage();
        
        for (int y = 0; y < preview.height(); ++y)
        {
            for (int x = 0; x < preview.width(); ++x)
            {
        
                const PreviewRgba &pixel = preview.pixel (x, y);
        
                // ...
        
            }
        }
    }
    // [end accessPreviewImage]
}